

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_h265e_vepu511.c
# Opt level: O0

MPP_RET vepu511_h265e_use_pass1_patch(H265eV511RegSet *regs,H265eV511HalContext *ctx)

{
  int iVar1;
  void *pvVar2;
  uint uVar3;
  RK_U32 RVar4;
  MPP_RET MVar5;
  MPP_RET ret;
  VepuFmtCfg *fmt;
  RK_S32 y_stride;
  RK_S32 height_align;
  RK_S32 width_align;
  H265eVepu511Frame *reg_frm;
  Vepu511ControlCfg *reg_ctl;
  H265eV511HalContext *ctx_local;
  H265eV511RegSet *regs_local;
  
  uVar3 = (ctx->cfg->prep).width + 0xf;
  iVar1 = (ctx->cfg->prep).height;
  pvVar2 = ctx->input_fmt;
  if ((hal_h265e_debug & 1) != 0) {
    _mpp_log_l(4,"hal_h265e_v511","enter\n","vepu511_h265e_use_pass1_patch");
  }
  (regs->reg_frm).common.enc_pic =
       (anon_struct_4_15_c9499a39_for_enc_pic)
       ((uint)(regs->reg_frm).common.enc_pic & 0xfeffffff | 0x1000000);
  (regs->reg_ctl).dtrns_map =
       (anon_struct_4_8_ec00e75a_for_dtrns_map)
       ((uint)(regs->reg_ctl).dtrns_map & 0xffffff0f | (*(uint *)((long)pvVar2 + 0x10) & 0xf) << 4);
  (regs->reg_frm).common.src_fmt =
       (anon_struct_4_9_1f148558_for_src_fmt)
       ((uint)(regs->reg_frm).common.src_fmt & 0xffffffc3 | 0x18);
  (regs->reg_frm).common.src_fmt =
       (anon_struct_4_9_1f148558_for_src_fmt)((uint)(regs->reg_frm).common.src_fmt & 0xfffffffe);
  (regs->reg_frm).common.src_fmt =
       (anon_struct_4_9_1f148558_for_src_fmt)((uint)(regs->reg_frm).common.src_fmt & 0xfffffffd);
  (regs->reg_frm).common.src_fmt =
       (anon_struct_4_9_1f148558_for_src_fmt)
       ((uint)(regs->reg_frm).common.src_fmt & 0xffffff7f | 0x80);
  (regs->reg_frm).common.src_strd0 =
       (anon_struct_4_2_9e7912bd_for_src_strd0)
       ((uint)(regs->reg_frm).common.src_strd0 & 0xffe00000 | uVar3 & 0x1ffff0);
  (regs->reg_frm).common.src_strd1 =
       (anon_struct_4_2_9e7912be_for_src_strd1)
       ((uint)(regs->reg_frm).common.src_strd1 & 0xffff0000 | uVar3 & 0xfff0);
  (regs->reg_frm).common.src_proc =
       (anon_struct_4_9_c8a120ae_for_src_proc)((uint)(regs->reg_frm).common.src_proc & 0xfbffffff);
  (regs->reg_frm).common.src_proc =
       (anon_struct_4_9_c8a120ae_for_src_proc)((uint)(regs->reg_frm).common.src_proc & 0xe7ffffff);
  RVar4 = mpp_buffer_get_fd_with_caller(ctx->buf_pass1,"vepu511_h265e_use_pass1_patch");
  (regs->reg_frm).common.adr_src0 = RVar4;
  (regs->reg_frm).common.adr_src1 = (regs->reg_frm).common.adr_src0;
  MVar5 = mpp_dev_multi_offset_update
                    (ctx->reg_cfg,0xa1,(uVar3 & 0xfffffff0) * (iVar1 + 0xfU & 0xfffffff0));
  if (MVar5 != MPP_OK) {
    _mpp_log_l(2,"hal_h265e_v511","set input cb addr offset failed %d\n",
               "vepu511_h265e_use_pass1_patch",(ulong)(uint)MVar5);
  }
  return MPP_OK;
}

Assistant:

static MPP_RET vepu511_h265e_use_pass1_patch(H265eV511RegSet *regs, H265eV511HalContext *ctx)
{
    Vepu511ControlCfg *reg_ctl = &regs->reg_ctl;
    H265eVepu511Frame *reg_frm = &regs->reg_frm;
    RK_S32 width_align = MPP_ALIGN(ctx->cfg->prep.width, 16);
    RK_S32 height_align = MPP_ALIGN(ctx->cfg->prep.height, 16);
    RK_S32 y_stride = width_align;
    VepuFmtCfg *fmt = (VepuFmtCfg *)ctx->input_fmt;
    MPP_RET ret = MPP_OK;

    hal_h265e_dbg_func("enter\n");

    reg_frm->common.enc_pic.rfpr_compress_mode = 1;
    reg_ctl->dtrns_map.src_bus_edin = fmt->src_endian;
    reg_frm->common.src_fmt.src_cfmt = VEPU541_FMT_YUV420SP;
    reg_frm->common.src_fmt.alpha_swap = 0;
    reg_frm->common.src_fmt.rbuv_swap = 0;
    reg_frm->common.src_fmt.out_fmt = 1;

    reg_frm->common.src_strd0.src_strd0 = y_stride;
    reg_frm->common.src_strd1.src_strd1 = y_stride;

    reg_frm->common.src_proc.src_mirr = 0;
    reg_frm->common.src_proc.src_rot = 0;

    reg_frm->common.adr_src0 = mpp_buffer_get_fd(ctx->buf_pass1);
    reg_frm->common.adr_src1 = reg_frm->common.adr_src0;

    /* input cb addr */
    ret = mpp_dev_multi_offset_update(ctx->reg_cfg, 161, width_align * height_align);
    if (ret)
        mpp_err_f("set input cb addr offset failed %d\n", ret);

    return MPP_OK;
}